

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

int __thiscall FNodeBuilder::CreateSeg(FNodeBuilder *this,int linenum,int sidenum)

{
  DWORD DVar1;
  DWORD DVar2;
  uint uVar3;
  line_t *plVar4;
  sector_t *psVar5;
  sector_t *psVar6;
  side_t *psVar7;
  FPrivVert *pFVar8;
  FPrivSeg *pFVar9;
  FPrivSeg *pFVar10;
  int iVar11;
  line_t *plVar12;
  int iVar13;
  sector_t **ppsVar14;
  sector_t **ppsVar15;
  line_t *plVar16;
  int local_4c;
  
  plVar4 = this->Level->Lines;
  plVar16 = (line_t *)&plVar4[linenum].v2;
  if (sidenum == 0) {
    ppsVar14 = &plVar4[linenum].frontsector;
    ppsVar15 = &plVar4[linenum].backsector;
    plVar12 = plVar4 + linenum;
  }
  else {
    ppsVar14 = &plVar4[linenum].backsector;
    ppsVar15 = &plVar4[linenum].frontsector;
    plVar12 = plVar16;
    plVar16 = plVar4 + linenum;
  }
  psVar5 = *ppsVar15;
  psVar6 = *ppsVar14;
  psVar7 = this->Level->Lines[linenum].sidedef[sidenum];
  if (psVar7 == (side_t *)0x0) {
    local_4c = -1;
  }
  else {
    local_4c = (int)((ulong)((long)psVar7 - (long)sides) >> 3) * 0x684bda13;
  }
  iVar13 = (int)plVar12->v1;
  pFVar8 = (this->Vertices).Array;
  DVar1 = pFVar8[iVar13].segs;
  iVar11 = (int)plVar16->v1;
  DVar2 = pFVar8[iVar11].segs2;
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Grow(&this->Segs,1);
  pFVar9 = (this->Segs).Array;
  uVar3 = (this->Segs).Count;
  pFVar9[uVar3].v1 = iVar13;
  pFVar9[uVar3].v2 = iVar11;
  pFVar9[uVar3].sidedef = local_4c;
  pFVar9[uVar3].linedef = linenum;
  pFVar9[uVar3].frontsector = psVar6;
  pFVar9[uVar3].backsector = psVar5;
  pFVar9[uVar3].next = 0xffffffff;
  pFVar9[uVar3].nextforvert = DVar1;
  pFVar9[uVar3].nextforvert2 = DVar2;
  pFVar10 = pFVar9 + uVar3;
  pFVar10->loopnum = 0;
  pFVar10->partner = 0xffffffff;
  *(undefined8 *)(&pFVar10->loopnum + 2) = 0xffffffffffffffff;
  pFVar9[uVar3].planefront = false;
  pFVar9[uVar3].hashnext = (FPrivSeg *)0x0;
  uVar3 = (this->Segs).Count;
  (this->Segs).Count = uVar3 + 1;
  pFVar8 = (this->Vertices).Array;
  pFVar8[iVar13].segs = uVar3;
  pFVar8[iVar11].segs2 = uVar3;
  return uVar3;
}

Assistant:

int FNodeBuilder::CreateSeg (int linenum, int sidenum)
{
	FPrivSeg seg;
	int segnum;

	seg.next = DWORD_MAX;
	seg.loopnum = 0;
	seg.partner = DWORD_MAX;
	seg.hashnext = NULL;
	seg.planefront = false;
	seg.planenum = DWORD_MAX;
	seg.storedseg = DWORD_MAX;

	if (sidenum == 0)
	{ // front
		seg.frontsector = Level.Lines[linenum].frontsector;
		seg.backsector = Level.Lines[linenum].backsector;
		seg.v1 = (int)(size_t)Level.Lines[linenum].v1;
		seg.v2 = (int)(size_t)Level.Lines[linenum].v2;
	}
	else
	{ // back
		seg.frontsector = Level.Lines[linenum].backsector;
		seg.backsector = Level.Lines[linenum].frontsector;
		seg.v2 = (int)(size_t)Level.Lines[linenum].v1;
		seg.v1 = (int)(size_t)Level.Lines[linenum].v2;
	}
	seg.linedef = linenum;
	side_t *sd = Level.Lines[linenum].sidedef[sidenum];
	seg.sidedef = sd != NULL? int(sd - sides) : int(NO_SIDE);
	seg.nextforvert = Vertices[seg.v1].segs;
	seg.nextforvert2 = Vertices[seg.v2].segs2;

	segnum = (int)Segs.Push (seg);
	Vertices[seg.v1].segs = segnum;
	Vertices[seg.v2].segs2 = segnum;
	D(Printf(PRINT_LOG, "Seg %4d: From line %d, side %s (%5d,%5d)-(%5d,%5d)  [%08x,%08x]-[%08x,%08x]\n", segnum, linenum, sidenum ? "back " : "front",
		Vertices[seg.v1].x>>16, Vertices[seg.v1].y>>16, Vertices[seg.v2].x>>16, Vertices[seg.v2].y>>16,
		Vertices[seg.v1].x, Vertices[seg.v1].y, Vertices[seg.v2].x, Vertices[seg.v2].y));

	return segnum;
}